

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_21::PosixColourImpl::use(PosixColourImpl *this,Code _colourCode)

{
  logic_error *this_00;
  undefined4 in_ESI;
  PosixColourImpl *in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  switch(in_ESI) {
  case 0:
  case 1:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 2:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 3:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 4:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 5:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 6:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 7:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 0x10:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"not a colour");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case 0x11:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 0x12:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 0x13:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 0x17:
    setColour(in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

virtual void use( Colour::Code _colourCode ) {
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0:34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );

                case Colour::Bright: throw std::logic_error( "not a colour" );
            }
        }